

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

bool __thiscall
slang::ast::TimingControl::visit<slang::ast::ConstraintExprVisitor>
          (TimingControl *this,ConstraintExprVisitor *visitor)

{
  logic_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->kind < (CycleDelay|SignalEvent)) {
    return (bool)(visitor->failed ^ 1);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,"");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar2) {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0.field_2._8_8_ = plVar1[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar2;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x123);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_f0 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) TimingControl::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case TimingControlKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case TimingControlKind::Invalid: return visitor.visit(*this, std::forward<Args>(args)...);
        CASE(Delay, DelayControl);
        CASE(Delay3, Delay3Control);
        CASE(SignalEvent, SignalEventControl);
        CASE(EventList, EventListControl);
        CASE(ImplicitEvent, ImplicitEventControl);
        CASE(RepeatedEvent, RepeatedEventControl);
        CASE(OneStepDelay, OneStepDelayControl);
        CASE(CycleDelay, CycleDelayControl);
        CASE(BlockEventList, BlockEventListControl);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}